

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

HighsStatus cleanBounds(HighsOptions *options,HighsLp *lp)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  HighsStatus HVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double local_48;
  
  bVar5 = 0 < lp->num_col_;
  if (lp->num_col_ < 1) {
    uVar7 = 0;
    local_48 = 0.0;
  }
  else {
    uVar8 = 0;
    uVar7 = 0;
    local_48 = 0.0;
    do {
      pdVar3 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar9 = pdVar3[uVar8];
      dVar1 = pdVar4[uVar8];
      dVar10 = dVar9 - dVar1;
      dVar2 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
      if (dVar2 < dVar10) {
        highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,
                     "Column %d has inconsistent bounds [%g, %g] (residual = %g) after presolve\n",
                     dVar9,dVar1,dVar10,uVar8 & 0xffffffff);
      }
      else if (0.0 < dVar10) {
        uVar7 = uVar7 + 1;
        if (local_48 <= dVar10) {
          local_48 = dVar10;
        }
        dVar9 = (dVar9 + dVar1) * 0.5;
        pdVar3[uVar8] = dVar9;
        pdVar4[uVar8] = dVar9;
      }
      if (dVar2 < dVar10) break;
      uVar8 = uVar8 + 1;
      bVar5 = (long)uVar8 < (long)lp->num_col_;
    } while ((long)uVar8 < (long)lp->num_col_);
  }
  HVar6 = kError;
  if (!bVar5) {
    bVar5 = 0 < lp->num_row_;
    if (0 < lp->num_row_) {
      uVar8 = 0;
      do {
        pdVar3 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar9 = pdVar3[uVar8];
        dVar1 = pdVar4[uVar8];
        dVar10 = dVar9 - dVar1;
        dVar2 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
        if (dVar2 < dVar10) {
          highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,
                       "Row %d has inconsistent bounds [%g, %g] (residual = %g) after presolve\n",
                       dVar9,dVar1,dVar10,uVar8 & 0xffffffff);
        }
        else if (0.0 < dVar10) {
          uVar7 = uVar7 + 1;
          if (local_48 <= dVar10) {
            local_48 = dVar10;
          }
          dVar9 = (dVar9 + dVar1) * 0.5;
          pdVar3[uVar8] = dVar9;
          pdVar4[uVar8] = dVar9;
        }
        if (dVar2 < dVar10) break;
        uVar8 = uVar8 + 1;
        bVar5 = (long)uVar8 < (long)lp->num_row_;
      } while ((long)uVar8 < (long)lp->num_row_);
    }
    HVar6 = kError;
    if (!bVar5) {
      if (uVar7 == 0) {
        HVar6 = kOk;
      }
      else {
        highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                     "Resolved %d inconsistent bounds (maximum residual = %9.4g) after presolve\n",
                     local_48,(ulong)uVar7);
        HVar6 = kWarning;
      }
    }
  }
  return HVar6;
}

Assistant:

HighsStatus cleanBounds(const HighsOptions& options, HighsLp& lp) {
  double max_residual = 0;
  HighsInt num_change = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double residual = lp.col_lower_[iCol] - lp.col_upper_[iCol];
    if (residual > options.primal_feasibility_tolerance) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Column %" HIGHSINT_FORMAT
                   " has inconsistent bounds [%g, %g] (residual = "
                   "%g) after presolve\n",
                   iCol, lp.col_lower_[iCol], lp.col_upper_[iCol], residual);
      return HighsStatus::kError;
    } else if (residual > 0) {
      num_change++;
      max_residual = std::max(residual, max_residual);
      double mid = 0.5 * (lp.col_lower_[iCol] + lp.col_upper_[iCol]);
      lp.col_lower_[iCol] = mid;
      lp.col_upper_[iCol] = mid;
    }
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double residual = lp.row_lower_[iRow] - lp.row_upper_[iRow];
    if (residual > options.primal_feasibility_tolerance) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Row %" HIGHSINT_FORMAT
                   " has inconsistent bounds [%g, %g] (residual = %g) "
                   "after presolve\n",
                   iRow, lp.row_lower_[iRow], lp.row_upper_[iRow], residual);
      return HighsStatus::kError;
    } else if (residual > 0) {
      num_change++;
      max_residual = std::max(residual, max_residual);
      double mid = 0.5 * (lp.row_lower_[iRow] + lp.row_upper_[iRow]);
      lp.row_lower_[iRow] = mid;
      lp.row_upper_[iRow] = mid;
    }
  }
  if (num_change) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Resolved %" HIGHSINT_FORMAT
                 " inconsistent bounds (maximum residual = "
                 "%9.4g) after presolve\n",
                 num_change, max_residual);
    return HighsStatus::kWarning;
  }
  return HighsStatus::kOk;
}